

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::BatchNorm_x86_avx::forward_inplace(BatchNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  void *pvVar11;
  _func_int **pp_Var12;
  size_t sVar13;
  size_t sVar14;
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  int iVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  float *pfVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [28];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  float in_register_0000139c;
  
  iVar6 = bottom_top_blob->elempack;
  iVar41 = bottom_top_blob->dims;
  iVar7 = bottom_top_blob->w;
  uVar8 = bottom_top_blob->h;
  iVar34 = bottom_top_blob->d;
  uVar9 = bottom_top_blob->c;
  if (iVar41 == 2) {
    iVar35 = iVar6 * iVar7;
    pp_Var12 = this->_vptr_BatchNorm_x86_avx;
    uVar38 = 0;
    uVar37 = 0;
    if (0 < (int)uVar8) {
      uVar37 = (ulong)uVar8;
    }
    for (; uVar38 != uVar37; uVar38 = uVar38 + 1) {
      lVar40 = *(long *)(&this->field_0x1f8 + (long)pp_Var12[-3]);
      lVar36 = *(long *)(&this->field_0x240 + (long)pp_Var12[-3]);
      fVar4 = *(float *)(lVar40 + uVar38 * 4);
      fVar5 = *(float *)(lVar36 + uVar38 * 4);
      if (iVar6 == 4) {
        auVar45 = *(undefined1 (*) [16])(lVar40 + uVar38 * 0x10);
        auVar47._16_16_ = auVar45;
        auVar47._0_16_ = auVar45;
        auVar44 = *(undefined1 (*) [16])(lVar36 + uVar38 * 0x10);
LAB_0018c9da:
        auVar50._16_16_ = auVar44;
        auVar50._0_16_ = auVar44;
        auVar48 = auVar50._0_28_;
      }
      else {
        auVar45 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
        auVar44 = vshufps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0);
        if (iVar6 != 8) {
          auVar15 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
          auVar47._16_16_ = auVar15;
          auVar47._0_16_ = auVar15;
          goto LAB_0018c9da;
        }
        auVar47 = *(undefined1 (*) [32])(lVar40 + uVar38 * 0x20);
        auVar48 = SUB3228(*(undefined1 (*) [32])(lVar36 + uVar38 * 0x20),0);
      }
      iVar10 = bottom_top_blob->w;
      pvVar11 = bottom_top_blob->data;
      sVar13 = bottom_top_blob->elemsize;
      pfVar43 = (float *)(uVar38 * (long)iVar10 * sVar13 + (long)pvVar11);
      lVar40 = 0;
      for (iVar39 = 0; iVar39 + 7 < iVar35; iVar39 = iVar39 + 8) {
        in_register_0000139c = in_register_0000139c + auVar47._28_4_;
        *pfVar43 = auVar48._0_4_ * *pfVar43 + auVar47._0_4_;
        pfVar43[1] = auVar48._4_4_ * pfVar43[1] + auVar47._4_4_;
        pfVar43[2] = auVar48._8_4_ * pfVar43[2] + auVar47._8_4_;
        pfVar43[3] = auVar48._12_4_ * pfVar43[3] + auVar47._12_4_;
        pfVar43[4] = auVar48._16_4_ * pfVar43[4] + auVar47._16_4_;
        pfVar43[5] = auVar48._20_4_ * pfVar43[5] + auVar47._20_4_;
        pfVar43[6] = auVar48._24_4_ * pfVar43[6] + auVar47._24_4_;
        pfVar43[7] = in_register_0000139c;
        pfVar43 = pfVar43 + 8;
        lVar40 = lVar40 + 8;
      }
      for (; iVar39 + 3 < iVar35; iVar39 = iVar39 + 4) {
        *pfVar43 = auVar44._0_4_ * *pfVar43 + auVar45._0_4_;
        pfVar43[1] = auVar44._4_4_ * pfVar43[1] + auVar45._4_4_;
        pfVar43[2] = auVar44._8_4_ * pfVar43[2] + auVar45._8_4_;
        pfVar43[3] = auVar44._12_4_ * pfVar43[3] + auVar45._12_4_;
        pfVar43 = pfVar43 + 4;
        lVar40 = lVar40 + 4;
      }
      lVar36 = sVar13 * uVar38 * (long)iVar10;
      for (; (int)lVar40 < iVar35; lVar40 = lVar40 + 1) {
        *(float *)((long)pvVar11 + lVar40 * 4 + lVar36) =
             fVar5 * *(float *)((long)pvVar11 + lVar40 * 4 + lVar36) + fVar4;
      }
    }
  }
  else if (iVar41 == 1) {
    pvVar11 = bottom_top_blob->data;
    lVar40 = *(long *)(&this->field_0x1f8 + (long)this->_vptr_BatchNorm_x86_avx[-3]);
    lVar36 = *(long *)(&this->field_0x240 + (long)this->_vptr_BatchNorm_x86_avx[-3]);
    iVar35 = iVar6 * iVar7;
    for (lVar42 = 0; (int)lVar42 + 7 < iVar35; lVar42 = lVar42 + 8) {
      pfVar43 = (float *)(lVar36 + lVar42 * 4);
      fVar4 = pfVar43[1];
      fVar5 = pfVar43[2];
      fVar16 = pfVar43[3];
      fVar17 = pfVar43[4];
      fVar18 = pfVar43[5];
      fVar19 = pfVar43[6];
      fVar20 = pfVar43[7];
      pfVar1 = (float *)((long)pvVar11 + lVar42 * 4);
      fVar21 = pfVar1[1];
      fVar22 = pfVar1[2];
      fVar23 = pfVar1[3];
      fVar24 = pfVar1[4];
      fVar25 = pfVar1[5];
      fVar26 = pfVar1[6];
      pfVar2 = (float *)(lVar40 + lVar42 * 4);
      fVar27 = pfVar2[1];
      fVar28 = pfVar2[2];
      fVar29 = pfVar2[3];
      fVar30 = pfVar2[4];
      fVar31 = pfVar2[5];
      fVar32 = pfVar2[6];
      fVar33 = pfVar2[7];
      pfVar3 = (float *)((long)pvVar11 + lVar42 * 4);
      *pfVar3 = *pfVar43 * *pfVar1 + *pfVar2;
      pfVar3[1] = fVar4 * fVar21 + fVar27;
      pfVar3[2] = fVar5 * fVar22 + fVar28;
      pfVar3[3] = fVar16 * fVar23 + fVar29;
      pfVar3[4] = fVar17 * fVar24 + fVar30;
      pfVar3[5] = fVar18 * fVar25 + fVar31;
      pfVar3[6] = fVar19 * fVar26 + fVar32;
      pfVar3[7] = fVar20 + fVar33;
    }
    for (; (int)lVar42 + 3 < iVar35; lVar42 = lVar42 + 4) {
      pfVar43 = (float *)(lVar36 + lVar42 * 4);
      fVar4 = pfVar43[1];
      fVar5 = pfVar43[2];
      fVar16 = pfVar43[3];
      pfVar1 = (float *)((long)pvVar11 + lVar42 * 4);
      fVar17 = pfVar1[1];
      fVar18 = pfVar1[2];
      fVar19 = pfVar1[3];
      pfVar2 = (float *)(lVar40 + lVar42 * 4);
      fVar20 = pfVar2[1];
      fVar21 = pfVar2[2];
      fVar22 = pfVar2[3];
      pfVar3 = (float *)((long)pvVar11 + lVar42 * 4);
      *pfVar3 = *pfVar43 * *pfVar1 + *pfVar2;
      pfVar3[1] = fVar4 * fVar17 + fVar20;
      pfVar3[2] = fVar5 * fVar18 + fVar21;
      pfVar3[3] = fVar16 * fVar19 + fVar22;
    }
    for (; (int)lVar42 < iVar35; lVar42 = lVar42 + 1) {
      *(float *)((long)pvVar11 + lVar42 * 4) =
           *(float *)((long)pvVar11 + lVar42 * 4) * *(float *)(lVar36 + lVar42 * 4) +
           *(float *)(lVar40 + lVar42 * 4);
    }
  }
  if (iVar41 - 3U < 2) {
    iVar34 = iVar7 * iVar6 * uVar8 * iVar34;
    pp_Var12 = this->_vptr_BatchNorm_x86_avx;
    uVar37 = 0;
    uVar38 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar38 = uVar37;
    }
    for (; uVar37 != uVar38; uVar37 = uVar37 + 1) {
      lVar40 = *(long *)(&this->field_0x1f8 + (long)pp_Var12[-3]);
      lVar36 = *(long *)(&this->field_0x240 + (long)pp_Var12[-3]);
      fVar4 = *(float *)(lVar40 + uVar37 * 4);
      fVar5 = *(float *)(lVar36 + uVar37 * 4);
      if (iVar6 == 4) {
        auVar45 = *(undefined1 (*) [16])(lVar40 + uVar37 * 0x10);
        auVar46._16_16_ = auVar45;
        auVar46._0_16_ = auVar45;
        auVar44 = *(undefined1 (*) [16])(lVar36 + uVar37 * 0x10);
LAB_0018c8a0:
        auVar49._16_16_ = auVar44;
        auVar49._0_16_ = auVar44;
        auVar48 = auVar49._0_28_;
      }
      else {
        auVar45 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
        auVar44 = vshufps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0);
        if (iVar6 != 8) {
          auVar15 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
          auVar46._16_16_ = auVar15;
          auVar46._0_16_ = auVar15;
          goto LAB_0018c8a0;
        }
        auVar46 = *(undefined1 (*) [32])(lVar40 + uVar37 * 0x20);
        auVar48 = SUB3228(*(undefined1 (*) [32])(lVar36 + uVar37 * 0x20),0);
      }
      sVar13 = bottom_top_blob->cstep;
      pvVar11 = bottom_top_blob->data;
      sVar14 = bottom_top_blob->elemsize;
      pfVar43 = (float *)(sVar13 * uVar37 * sVar14 + (long)pvVar11);
      lVar40 = 0;
      for (iVar41 = 0; iVar41 + 7 < iVar34; iVar41 = iVar41 + 8) {
        in_register_0000139c = in_register_0000139c + auVar46._28_4_;
        *pfVar43 = auVar48._0_4_ * *pfVar43 + auVar46._0_4_;
        pfVar43[1] = auVar48._4_4_ * pfVar43[1] + auVar46._4_4_;
        pfVar43[2] = auVar48._8_4_ * pfVar43[2] + auVar46._8_4_;
        pfVar43[3] = auVar48._12_4_ * pfVar43[3] + auVar46._12_4_;
        pfVar43[4] = auVar48._16_4_ * pfVar43[4] + auVar46._16_4_;
        pfVar43[5] = auVar48._20_4_ * pfVar43[5] + auVar46._20_4_;
        pfVar43[6] = auVar48._24_4_ * pfVar43[6] + auVar46._24_4_;
        pfVar43[7] = in_register_0000139c;
        pfVar43 = pfVar43 + 8;
        lVar40 = lVar40 + 8;
      }
      for (; iVar41 + 3 < iVar34; iVar41 = iVar41 + 4) {
        *pfVar43 = auVar44._0_4_ * *pfVar43 + auVar45._0_4_;
        pfVar43[1] = auVar44._4_4_ * pfVar43[1] + auVar45._4_4_;
        pfVar43[2] = auVar44._8_4_ * pfVar43[2] + auVar45._8_4_;
        pfVar43[3] = auVar44._12_4_ * pfVar43[3] + auVar45._12_4_;
        pfVar43 = pfVar43 + 4;
        lVar40 = lVar40 + 4;
      }
      lVar36 = sVar13 * sVar14 * uVar37;
      for (; (int)lVar40 < iVar34; lVar40 = lVar40 + 1) {
        *(float *)((long)pvVar11 + lVar40 * 4 + lVar36) =
             fVar5 * *(float *)((long)pvVar11 + lVar40 * 4 + lVar36) + fVar4;
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}